

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O1

void __thiscall pybind11::str::str(str *this,object *o)

{
  PyObject *tmp;
  PyObject *pPVar1;
  error_already_set *this_00;
  
  pPVar1 = (o->super_handle).m_ptr;
  if ((pPVar1 == (PyObject *)0x0) || ((pPVar1->ob_type->tp_flags & 0x10000000) == 0)) {
    pPVar1 = (PyObject *)PyObject_Str(pPVar1);
  }
  else {
    (o->super_handle).m_ptr = (PyObject *)0x0;
  }
  (this->super_object).super_handle.m_ptr = pPVar1;
  if (pPVar1 != (PyObject *)0x0) {
    return;
  }
  this_00 = (error_already_set *)__cxa_allocate_exception(0x18);
  error_already_set::error_already_set(this_00);
  __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
}

Assistant:

str(const char *c, const SzType &n)
        : object(PyUnicode_FromStringAndSize(c, ssize_t_cast(n)), stolen_t{}) {
        if (!m_ptr) {
            if (PyErr_Occurred()) {
                throw error_already_set();
            }
            pybind11_fail("Could not allocate string object!");
        }
    }